

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void deThread_selfTest(void)

{
  deBool dVar1;
  deThread dVar2;
  void *pvVar3;
  long *in_FS_OFFSET;
  deThread thread_4;
  deThread thread_3;
  deThreadLocal tls;
  int ndx;
  deBool ret_2;
  deThread thread_2;
  ThreadData3 data;
  deInt32 ret_1;
  deThread thread_1;
  deThread thread;
  deBool ret;
  deInt32 val;
  
  deSleep(0);
  deSleep(100);
  deYield();
  thread._4_4_ = 0x7b;
  dVar2 = deThread_create(threadTestThr1,(void *)((long)&thread + 4),(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (dVar2 == 0)) {
      deAssertFail("thread",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x61);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  thread._0_4_ = deThread_join(dVar2);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || ((deBool)thread == 0)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,100);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deThread_destroy(dVar2);
  register0x00000000 = deThread_create(threadTestThr2,(void *)0x0,(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (stack0xffffffffffffffe0 == 0)) {
      deAssertFail("thread",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x6d);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  data.bytes._8_4_ = deThread_join(stack0xffffffffffffffe0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (data.bytes._8_4_ == 0)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x70);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deThread_destroy(stack0xffffffffffffffe0);
  deMemset((void *)((long)&thread_2 + 4),0,0x10);
  _ndx = deThread_create(threadTestThr3,(void *)((long)&thread_2 + 4),(deThreadAttributes *)0x0);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (_ndx == 0)) {
      deAssertFail("thread",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x7f);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  tls._4_4_ = deThread_join(_ndx);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (tls._4_4_ == 0)) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x82);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  for (tls._0_4_ = 0; (int)tls < 0x10; tls._0_4_ = (int)tls + 1) {
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (*(char *)((long)&thread_2 + (long)(int)tls + 4) != -1)) {
        deAssertFail("data.bytes[ndx] == 0xff",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0x85);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
  }
  deThread_destroy(_ndx);
  thread_3 = deThreadLocal_create();
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (thread_3 == 0)) {
      deAssertFail("tls",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x90);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deThreadLocal_set(thread_3,(void *)0xff);
  dVar2 = deThread_create(threadTestThr4,&thread_3,(deThreadAttributes *)0x0);
  deThread_join(dVar2);
  deThread_destroy(dVar2);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (pvVar3 = deThreadLocal_get(thread_3), pvVar3 != (void *)0xff)) {
      deAssertFail("(deUintptr)deThreadLocal_get(tls) == 0xff",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x98);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  deThreadLocal_destroy(thread_3);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (*(int *)(*in_FS_OFFSET + -4) != 0x7b)) {
      deAssertFail("tls_testVar == 123",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xa0);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  *(undefined4 *)(*in_FS_OFFSET + -4) = 1;
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (*(int *)(*in_FS_OFFSET + -4) != 1)) {
      deAssertFail("tls_testVar == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xa2);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  dVar2 = deThread_create(tlsTestThr,(void *)0x0,(deThreadAttributes *)0x0);
  deThread_join(dVar2);
  deThread_destroy(dVar2);
  do {
    dVar1 = deGetFalse();
    if ((dVar1 != 0) || (*(int *)(*in_FS_OFFSET + -4) != 1)) {
      deAssertFail("tls_testVar == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xa8);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  *(undefined4 *)(*in_FS_OFFSET + -4) = 0x7b;
  return;
}

Assistant:

void deThread_selfTest (void)
{
	/* Test sleep & yield. */
	deSleep(0);
	deSleep(100);
	deYield();

	/* Thread test 1. */
	{
		deInt32		val		= 123;
		deBool		ret;
		deThread	thread	= deThread_create(threadTestThr1, &val, DE_NULL);
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deThread_destroy(thread);
	}

	/* Thread test 2. */
	{
		deThread	thread	= deThread_create(threadTestThr2, DE_NULL, DE_NULL);
		deInt32		ret;
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deThread_destroy(thread);
	}

	/* Thread test 3. */
	{
		ThreadData3	data;
		deThread	thread;
		deBool		ret;
		int			ndx;

		deMemset(&data, 0, sizeof(ThreadData3));

		thread = deThread_create(threadTestThr3, &data, DE_NULL);
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data.bytes); ndx++)
			DE_TEST_ASSERT(data.bytes[ndx] == 0xff);

		deThread_destroy(thread);
	}

	/* Test tls. */
	{
		deThreadLocal	tls;
		deThread		thread;

		tls = deThreadLocal_create();
		DE_TEST_ASSERT(tls);

		deThreadLocal_set(tls, (void*)(deUintptr)0xff);

		thread = deThread_create(threadTestThr4, &tls, DE_NULL);
		deThread_join(thread);
		deThread_destroy(thread);

		DE_TEST_ASSERT((deUintptr)deThreadLocal_get(tls) == 0xff);
		deThreadLocal_destroy(tls);
	}

#if defined(DE_THREAD_LOCAL)
	{
		deThread thread;

		DE_TEST_ASSERT(tls_testVar == 123);
		tls_testVar = 1;
		DE_TEST_ASSERT(tls_testVar == 1);

		thread = deThread_create(tlsTestThr, DE_NULL, DE_NULL);
		deThread_join(thread);
		deThread_destroy(thread);

		DE_TEST_ASSERT(tls_testVar == 1);
		tls_testVar = 123;
	}
#endif
}